

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void __thiscall
RigidBodyDynamics::ConstraintSet::calcForces
          (ConstraintSet *this,uint groupIndex,Model *model,VectorNd *Q,VectorNd *QDot,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodyIdsUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          bool resolveAllInRootFrame,bool updKin)

{
  long *plVar1;
  
  if (updKin) {
    UpdateKinematicsCustom(model,Q,QDot,(VectorNd *)0x0);
  }
  plVar1 = *(long **)(*(long *)(this + 200) + (ulong)groupIndex * 0x10);
  (**(code **)(*plVar1 + 0x28))
            (0,plVar1,model,Q,QDot,this + 0x198,this + 0x130,constraintBodyIdsUpd,
             constraintBodyFramesUpd,constraintForcesUpd,this + 0x620,resolveAllInRootFrame,updKin);
  return;
}

Assistant:

void ConstraintSet::calcForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintForcesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,force,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintForcesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);
}